

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O0

void __thiscall FKeyBindings::DefaultBind(FKeyBindings *this,char *keyname,char *cmd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  int local_28;
  int i;
  int key;
  char *cmd_local;
  char *keyname_local;
  FKeyBindings *this_local;
  
  iVar2 = GetKeyFromName(keyname);
  if (iVar2 == 0) {
    Printf("Unknown key \"%s\"\n",keyname);
  }
  else {
    bVar1 = FString::IsEmpty(this->Binds + iVar2);
    if (bVar1) {
      for (local_28 = 0; local_28 < 0x1c4; local_28 = local_28 + 1) {
        bVar1 = FString::IsEmpty(this->Binds + local_28);
        if (!bVar1) {
          __s1 = FString::operator_cast_to_char_(this->Binds + local_28);
          iVar3 = strcasecmp(__s1,cmd);
          if (iVar3 == 0) {
            return;
          }
        }
      }
      FString::operator=(this->Binds + iVar2,cmd);
    }
  }
  return;
}

Assistant:

void FKeyBindings::DefaultBind(const char *keyname, const char *cmd)
{
	int key = GetKeyFromName (keyname);
	if (key == 0)
	{
		Printf ("Unknown key \"%s\"\n", keyname);
		return;
	}
	if (!Binds[key].IsEmpty())
	{ // This key is already bound.
		return;
	}
	for (int i = 0; i < NUM_KEYS; ++i)
	{
		if (!Binds[i].IsEmpty() && stricmp (Binds[i], cmd) == 0)
		{ // This command is already bound to a key.
			return;
		}
	}
	// It is safe to do the bind, so do it.
	Binds[key] = cmd;
}